

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void __thiscall cppforth::Forth::source(Forth *this)

{
  Cell CVar1;
  Forth *this_local;
  
  requireDStackAvailable(this,2,"SOURCE");
  CVar1 = getDataCell(this,this->VarOffsetSourceAddress);
  push(this,CVar1);
  CVar1 = getDataCell(this,this->VarOffsetSourceSize);
  push(this,CVar1);
  return;
}

Assistant:

void source() {
			REQUIRE_DSTACK_AVAILABLE(2, "SOURCE");
			push(getDataCell(VarOffsetSourceAddress)); 
			push(getDataCell(VarOffsetSourceSize));
		}